

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

sxi32 SyHashRelease(SyHash *pHash)

{
  SyHashEntry_Pr *pSVar1;
  SyHashEntry_Pr *pNext;
  SyHashEntry_Pr *pEntry;
  SyHash *pHash_local;
  
  pNext = pHash->pList;
  while (pHash->nEntry != 0) {
    pSVar1 = pNext->pNext;
    SyMemBackendPoolFree(pHash->pAllocator,pNext);
    pHash->nEntry = pHash->nEntry - 1;
    pNext = pSVar1;
  }
  if (pHash->apBucket != (SyHashEntry_Pr **)0x0) {
    SyMemBackendFree(pHash->pAllocator,pHash->apBucket);
  }
  pHash->apBucket = (SyHashEntry_Pr **)0x0;
  pHash->nBucketSize = 0;
  pHash->pAllocator = (SyMemBackend *)0x0;
  return 0;
}

Assistant:

JX9_PRIVATE sxi32 SyHashRelease(SyHash *pHash)
{
	SyHashEntry_Pr *pEntry, *pNext;
#if defined(UNTRUST)
	if( INVALID_HASH(pHash)  ){
		return SXERR_EMPTY;
	}
#endif
	pEntry = pHash->pList;
	for(;;){
		if( pHash->nEntry == 0 ){
			break;
		}
		pNext = pEntry->pNext;
		SyMemBackendPoolFree(pHash->pAllocator, pEntry);
		pEntry = pNext;
		pHash->nEntry--;
	}
	if( pHash->apBucket ){
		SyMemBackendFree(pHash->pAllocator, (void *)pHash->apBucket);
	}
	pHash->apBucket = 0;
	pHash->nBucketSize = 0;
	pHash->pAllocator = 0;
	return SXRET_OK;
}